

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

bool __thiscall deqp::egl::ConfigFilter::isMatch(ConfigFilter *this,SurfaceConfig *config)

{
  undefined4 attribute;
  undefined4 uVar1;
  bool bVar2;
  deBool dVar3;
  uint uVar4;
  pointer ppVar5;
  TestError *pTVar6;
  EGLint cfgValue;
  EGLenum local_40;
  uint uStack_3c;
  AttribRule rule;
  _Self local_28;
  const_iterator iter;
  SurfaceConfig *config_local;
  ConfigFilter *this_local;
  
  iter._M_node = (_Base_ptr)config;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
       ::begin(&this->m_rules);
  do {
    rule._8_8_ = std::
                 map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
                 ::end(&this->m_rules);
    bVar2 = std::operator!=(&local_28,(_Self *)&rule.criteria);
    if (!bVar2) {
      return true;
    }
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>::
             operator->(&local_28);
    attribute = (ppVar5->second).name;
    uVar1 = (ppVar5->second).value;
    rule.name = (ppVar5->second).criteria;
    rule.value = (ppVar5->second).sortOrder;
    if (uVar1 != 0xffffffff) {
      if (attribute == 0x3041) {
        do {
          dVar3 = ::deGetFalse();
          if ((dVar3 != 0) || (uVar1 != 0x3038)) {
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,(char *)0x0,"rule.value == EGL_NONE",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                       ,400);
            __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
      }
      else if (((attribute != 0x3037) && (attribute != 0x3036)) && (attribute != 0x3035)) {
        uVar4 = SurfaceConfig::getAttribute((SurfaceConfig *)iter._M_node,attribute);
        if (rule.name == 0) {
          if ((int)uVar4 < (int)uVar1) {
            return false;
          }
        }
        else if (rule.name == 1) {
          if (uVar1 != uVar4) {
            return false;
          }
        }
        else {
          if (rule.name != 2) {
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,"Unknown criteria",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                       ,0x1a9);
            __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          if ((uVar1 & uVar4) != uVar1) {
            return false;
          }
        }
      }
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>::operator++
              (&local_28,0);
  } while( true );
}

Assistant:

bool isMatch (const SurfaceConfig& config) const
	{
		for (std::map<EGLenum, AttribRule>::const_iterator iter = m_rules.begin(); iter != m_rules.end(); iter++)
		{
			const AttribRule rule = iter->second;

			if (rule.value == EGL_DONT_CARE)
				continue;
			else if (rule.name == EGL_MATCH_NATIVE_PIXMAP)
				TCU_CHECK(rule.value == EGL_NONE); // Not supported
			else if (rule.name == EGL_TRANSPARENT_RED_VALUE || rule.name == EGL_TRANSPARENT_GREEN_VALUE || rule.name == EGL_TRANSPARENT_BLUE_VALUE)
				continue;
			else
			{
				const EGLint cfgValue = config.getAttribute(rule.name);

				switch (rule.criteria)
				{
					case CRITERIA_EXACT:
						if (rule.value != cfgValue)
							return false;
						break;

					case CRITERIA_AT_LEAST:
						if (rule.value > cfgValue)
							return false;
						break;

					case CRITERIA_MASK:
						if ((rule.value & cfgValue) != rule.value)
							return false;
						break;

					default:
						TCU_FAIL("Unknown criteria");
				}
			}
		}

		return true;
	}